

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-strip.cc
# Opt level: O2

int ProgramMain(int argc,char **argv)

{
  _Alloc_hider _Var1;
  Result RVar2;
  Result RVar3;
  wabt *this;
  char *out_data;
  string_view filename;
  string_view filename_00;
  _Any_data local_1d8;
  undefined3 uStack_1c8;
  undefined5 uStack_1c5;
  code *local_1c0;
  undefined4 local_1b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  _Any_data local_188;
  code *local_178;
  code *local_170;
  Errors errors;
  Features local_14b;
  BinaryReaderStrip reader;
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_90;
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_60;
  
  wabt::InitStdio();
  wabt::OptionParser::OptionParser
            ((OptionParser *)&reader,"wasm-strip",
             "  Remove sections of a WebAssembly binary file.\n\nexamples:\n  # Remove all custom sections from test.wasm\n  $ wasm-strip test.wasm\n"
            );
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1d8._M_pod_data,"filename",(allocator<char> *)&file_data);
  local_188._M_unused._M_object = (code **)0x0;
  local_188._8_8_ = 0;
  local_170 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-strip.cc:45:22)>
              ::_M_invoke;
  local_178 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-strip.cc:45:22)>
              ::_M_manager;
  wabt::OptionParser::AddArgument
            ((OptionParser *)&reader,(string *)&local_1d8,One,(Callback *)&local_188);
  if (local_178 != (code *)0x0) {
    (*local_178)(&local_188,&local_188,3);
  }
  std::__cxx11::string::_M_dispose();
  local_1d8._M_unused._M_object = (void *)0x0;
  local_1d8._8_7_ = 0;
  local_1c0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-strip.cc:50:20)>
              ::_M_invoke;
  local_1d8._M_pod_data[0xf] = '\0';
  uStack_1c8 = 0x10c9ac;
  uStack_1c5 = 0;
  wabt::OptionParser::AddOption
            ((OptionParser *)&reader,'o',"output","FILE","output wasm binary file",
             (Callback *)&local_1d8);
  if ((code *)CONCAT53(uStack_1c5,uStack_1c8) != (code *)0x0) {
    (*(code *)CONCAT53(uStack_1c5,uStack_1c8))(&local_1d8,&local_1d8,3);
  }
  local_1d8._M_unused._M_object = (void *)0x0;
  local_1d8._8_7_ = 0;
  local_1c0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-strip.cc:53:20)>
              ::_M_invoke;
  local_1d8._M_pod_data[0xf] = '\0';
  uStack_1c8 = 0x10c9f0;
  uStack_1c5 = 0;
  wabt::OptionParser::AddOption
            ((OptionParser *)&reader,'k',"keep-section","SECTION NAME",
             "Section name to keep in the final output",(Callback *)&local_1d8);
  if ((code *)CONCAT53(uStack_1c5,uStack_1c8) != (code *)0x0) {
    (*(code *)CONCAT53(uStack_1c5,uStack_1c8))(&local_1d8,&local_1d8,3);
  }
  local_1d8._M_unused._M_object = (void *)0x0;
  local_1d8._8_7_ = 0;
  local_1c0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-strip.cc:58:20)>
              ::_M_invoke;
  local_1d8._M_pod_data[0xf] = '\0';
  uStack_1c8 = 0x10ca34;
  uStack_1c5 = 0;
  out_data = "SECTION NAME";
  wabt::OptionParser::AddOption
            ((OptionParser *)&reader,'R',"remove-section","SECTION NAME",
             "Section to specifically remove, including all the rest",(Callback *)&local_1d8);
  if ((code *)CONCAT53(uStack_1c5,uStack_1c8) != (code *)0x0) {
    (*(code *)CONCAT53(uStack_1c5,uStack_1c8))(&local_1d8,&local_1d8,3);
  }
  wabt::OptionParser::Parse((OptionParser *)&reader,argc,argv);
  wabt::OptionParser::~OptionParser((OptionParser *)&reader);
  _Var1 = s_filename_abi_cxx11_._M_dataplus;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this = (wabt *)strlen(s_filename_abi_cxx11_._M_dataplus._M_p);
  filename._M_str = (char *)&file_data;
  filename._M_len = (size_t)_Var1._M_p;
  RVar2 = wabt::ReadFile(this,filename,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)out_data);
  if (RVar2.enum_ == Error) {
    RVar2.enum_ = Error;
  }
  else {
    errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_14b.exceptions_enabled_ = false;
    local_14b.mutable_globals_enabled_ = true;
    local_14b.sat_float_to_int_enabled_ = true;
    local_14b.sign_extension_enabled_ = true;
    local_14b.simd_enabled_ = true;
    local_14b.threads_enabled_ = false;
    local_14b.function_references_enabled_ = false;
    local_14b.multi_value_enabled_ = true;
    local_14b.tail_call_enabled_ = false;
    local_14b.bulk_memory_enabled_ = true;
    local_14b.reference_types_enabled_ = true;
    local_14b.annotations_enabled_ = false;
    local_14b.code_metadata_enabled_ = false;
    local_14b.gc_enabled_ = false;
    local_14b.memory64_enabled_ = false;
    local_14b.multi_memory_enabled_ = false;
    local_14b.extended_const_enabled_ = false;
    local_14b.relaxed_simd_enabled_ = false;
    local_14b.custom_page_sizes_enabled_ = false;
    wabt::Features::EnableAll(&local_14b);
    local_1d8._M_unused._M_member_pointer = CONCAT71(local_14b._1_7_,local_14b.exceptions_enabled_);
    local_1d8._8_7_ =
         CONCAT43(local_14b._11_4_,CONCAT21(local_14b._9_2_,local_14b.tail_call_enabled_));
    uStack_1c8 = local_14b._16_3_;
    local_1d8._M_pod_data[0xf] = local_14b.multi_memory_enabled_;
    local_1c0 = (code *)0x0;
    local_1b8 = 0x100;
    std::
    _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::_Rb_tree(&local_60,&v_sections_to_keep._M_t);
    std::
    _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::_Rb_tree(&local_90,&v_sections_to_remove._M_t);
    BinaryReaderStrip::BinaryReaderStrip
              (&reader,(set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        *)&local_60,
               (set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)&local_90,&errors);
    std::
    _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~_Rb_tree(&local_90);
    std::
    _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~_Rb_tree(&local_60);
    RVar3 = wabt::ReadBinary(file_data.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,
                             (long)file_data.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)file_data.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                             (BinaryReaderDelegate *)&reader,(ReadBinaryOptions *)&local_1d8);
    local_188._M_unused._M_object = &local_178;
    local_188._8_8_ = 0;
    local_178 = (code *)((ulong)local_178 & 0xffffffffffffff00);
    RVar2.enum_ = Error;
    wabt::FormatErrorsToFile
              (&errors,Binary,(LexerSourceLineFinder *)0x0,_stderr,(string *)&local_188,Never,0x50);
    std::__cxx11::string::_M_dispose();
    if (RVar3.enum_ != Error) {
      if (s_outfile_abi_cxx11_._M_string_length == 0) {
        std::__cxx11::string::_M_assign((string *)&s_outfile_abi_cxx11_);
      }
      filename_00._M_str = s_outfile_abi_cxx11_._M_dataplus._M_p;
      filename_00._M_len = s_outfile_abi_cxx11_._M_string_length;
      RVar2 = wabt::OutputBuffer::WriteToFile
                        ((OutputBuffer *)
                         reader.stream_.buf_._M_t.
                         super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>
                         .super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl,
                         filename_00);
    }
    BinaryReaderStrip::~BinaryReaderStrip(&reader);
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&errors);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return RVar2.enum_;
}

Assistant:

int ProgramMain(int argc, char** argv) {
  Result result;

  InitStdio();
  ParseOptions(argc, argv);

  std::vector<uint8_t> file_data;
  result = ReadFile(s_filename.c_str(), &file_data);
  if (Failed(result)) {
    return Result::Error;
  }

  Errors errors;
  Features features;
  features.EnableAll();
  const bool kReadDebugNames = false;
  const bool kStopOnFirstError = true;
  const bool kFailOnCustomSectionError = false;
  ReadBinaryOptions options(features, nullptr, kReadDebugNames,
                            kStopOnFirstError, kFailOnCustomSectionError);

  BinaryReaderStrip reader(v_sections_to_keep, v_sections_to_remove, &errors);
  result = ReadBinary(file_data.data(), file_data.size(), &reader, options);
  FormatErrorsToFile(errors, Location::Type::Binary);
  if (Failed(result)) {
    return Result::Error;
  }

  if (s_outfile.empty()) {
    s_outfile = s_filename;
  }
  return reader.WriteToFile(s_outfile);
}